

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  bool bVar1;
  ArenaDtorNeeds AVar2;
  Options *in_RCX;
  long lVar3;
  Printer *p_local;
  allocator<char> local_22a;
  allocator<char> local_229;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  string local_1e0;
  string local_1c0;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"superclass",&local_229);
  options = &this->options_;
  SuperClassName_abi_cxx11_(&local_1e0,(cpp *)this->descriptor_,(Descriptor *)options,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"ctor_body",&local_22a);
  local_e8 = local_d8;
  if (local_228 == local_218) {
    uStack_d0 = uStack_210;
  }
  else {
    local_e8 = local_228;
  }
  local_e0 = local_220;
  local_220 = 0;
  local_218[0] = 0;
  local_1f8 = (code *)0x0;
  pcStack_1f0 = (code *)0x0;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_228 = local_218;
  local_208._M_unused._M_object = operator_new(0x18);
  *(MessageGenerator **)local_208._M_unused._0_8_ = this;
  *(Printer ***)((long)local_208._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_208._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_1f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (p,&local_1a0,2,0x16f,
             "\n        $classname$::$classname$(::$proto_ns$::Arena* arena)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n            : $superclass$(arena, _class_data_.base()) {\n#else   // PROTOBUF_CUSTOM_VTABLE\n            : $superclass$(arena) {\n#endif  // PROTOBUF_CUSTOM_VTABLE\n          $ctor_body$;\n          // @@protoc_insertion_point(arena_constructor:$full_name$)\n        }\n      "
            );
  lVar3 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_1a0.key_._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar1 = UsingImplicitWeakFields(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
  if ((bVar1) || (bVar1 = ImplHasCopyCtor(this), bVar1)) {
    io::Printer::Emit(p_local,0xc4,
                      "\n      $classname$::$classname$(\n          //~ Force alignment\n          ::$proto_ns$::Arena* arena, const $classname$& from)\n          : $classname$(arena) {\n        MergeFrom(from);\n      }\n    "
                     );
  }
  else {
    GenerateArenaEnabledCopyConstructor(this,p_local);
  }
  GenerateSharedConstructorCode(this,p_local);
  bVar1 = HasSimpleBaseClass(this->descriptor_,options);
  if (!bVar1) {
    io::Printer::Emit(p_local,0x9c,
                      "\n          $classname$::~$classname$() {\n            // @@protoc_insertion_point(destructor:$full_name$)\n            SharedDtor(*this);\n          }\n        "
                     );
  }
  GenerateSharedDestructorCode(this,p_local);
  AVar2 = NeedsArenaDestructor(this);
  if (0 < (int)AVar2) {
    GenerateArenaDestructorCode(this,p_local);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStructors(io::Printer* p) {
  p->Emit(
      {
          {"superclass", SuperClassName(descriptor_, options_)},
          {"ctor_body",
           [&] {
             if (HasSimpleBaseClass(descriptor_, options_)) return;
             p->Emit(R"cc(SharedCtor(arena);)cc");
             switch (NeedsArenaDestructor()) {
               case ArenaDtorNeeds::kRequired: {
                 p->Emit(R"cc(
                   if (arena != nullptr) {
                     arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);
                   }
                 )cc");
                 break;
               }
               case ArenaDtorNeeds::kOnDemand: {
                 p->Emit(R"cc(
                   ::_pbi::InternalRegisterArenaDtor(arena, this,
                                                     &$classname$::ArenaDtor);
                 )cc");
                 break;
               }
               case ArenaDtorNeeds::kNone:
                 break;
             }
           }},
      },
      R"cc(
        $classname$::$classname$(::$proto_ns$::Arena* arena)
#if defined(PROTOBUF_CUSTOM_VTABLE)
            : $superclass$(arena, _class_data_.base()) {
#else   // PROTOBUF_CUSTOM_VTABLE
            : $superclass$(arena) {
#endif  // PROTOBUF_CUSTOM_VTABLE
          $ctor_body$;
          // @@protoc_insertion_point(arena_constructor:$full_name$)
        }
      )cc");

  // Generate the copy constructor.
  if (UsingImplicitWeakFields(descriptor_->file(), options_)) {
    // If we are in lite mode and using implicit weak fields, we generate a
    // one-liner copy constructor that delegates to MergeFrom. This saves some
    // code size and also cuts down on the complexity of implicit weak fields.
    // We might eventually want to do this for all lite protos.
    p->Emit(R"cc(
      $classname$::$classname$(
          //~ Force alignment
          ::$proto_ns$::Arena* arena, const $classname$& from)
          : $classname$(arena) {
        MergeFrom(from);
      }
    )cc");
  } else if (ImplHasCopyCtor()) {
    p->Emit(R"cc(
      $classname$::$classname$(
          //~ Force alignment
          ::$proto_ns$::Arena* arena, const $classname$& from)
          : $classname$(arena) {
        MergeFrom(from);
      }
    )cc");
  } else {
    GenerateArenaEnabledCopyConstructor(p);
  }

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(p);

  // Generate the destructor.
  if (HasSimpleBaseClass(descriptor_, options_)) {
    // For messages using simple base classes, having no destructor
    // allows our vtable to share the same destructor as every other
    // message with a simple base class.  This works only as long as
    // we have no fields needing destruction, of course.  (No strings
    // or extensions)
  } else {
    p->Emit(
        R"cc(
          $classname$::~$classname$() {
            // @@protoc_insertion_point(destructor:$full_name$)
            SharedDtor(*this);
          }
        )cc");
  }

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(p);

  // Generate the arena-specific destructor code.
  if (NeedsArenaDestructor() > ArenaDtorNeeds::kNone) {
    GenerateArenaDestructorCode(p);
  }
}